

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O3

void __thiscall KosarajuSCC::_set_levels(KosarajuSCC *this,int start,int sink)

{
  vector<bool,_std::allocator<bool>_> *pvVar1;
  vector<int,std::allocator<int>> *this_00;
  iterator *piVar2;
  _Bit_type *p_Var3;
  pointer pvVar4;
  iterator iVar5;
  pointer piVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  mapped_type *pmVar11;
  pointer piVar12;
  _Elt_pointer piVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  size_type __n;
  int edges;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  scc_graph_ends;
  queue<int,_std::deque<int,_std::allocator<int>_>_> topo;
  stack<int,_std::deque<int,_std::allocator<int>_>_> s;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  scc_graph_out;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  matrix;
  allocator_type local_1b9;
  int local_1b8;
  uint local_1b4;
  ulong local_1b0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1a8;
  int local_184;
  int local_180;
  int local_17c;
  _Deque_base<int,_std::allocator<int>_> local_178;
  undefined1 local_128 [8];
  pointer piStack_120;
  _Bit_type *local_118;
  uint uStack_110;
  undefined4 uStack_10c;
  _Bit_pointer local_108;
  undefined1 local_f8 [16];
  _Bit_type *local_e8;
  uint uStack_e0;
  undefined4 uStack_dc;
  _Bit_pointer local_d8;
  _Deque_base<int,_std::allocator<int>_> local_c8;
  vector<bool,_std::allocator<bool>_> *local_78;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_70;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  iVar10 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start[start];
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_17c = start;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_c8,0);
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_c8,&local_17c);
  }
  else {
    *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = start;
    local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_178._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_60,
           (long)((int)((ulong)((long)(this->sccs).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->sccs).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555)
           ,(value_type *)&local_178,(allocator_type *)local_f8);
  if ((__buckets_ptr)local_178._M_impl.super__Deque_impl_data._M_map != (__buckets_ptr)0x0) {
    operator_delete(local_178._M_impl.super__Deque_impl_data._M_map);
  }
  local_1a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (vector<int,_std::allocator<int>_> *)0x0;
  local_1a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (vector<int,_std::allocator<int>_> *)0x0;
  local_f8._0_8_ = local_f8._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_178,
             (long)((int)((ulong)((long)(this->sccs).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->sccs).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x55555555),(bool *)local_f8,(allocator_type *)local_128);
  pvVar1 = &this->is_mand;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&pvVar1->super__Bvector_base<std::allocator<bool>_>);
  (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)local_178._M_impl.super__Deque_impl_data._M_start._M_last;
  (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (_Bit_type *)local_178._M_impl.super__Deque_impl_data._M_start._M_cur;
  *(_Elt_pointer *)
   &(this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset =
       local_178._M_impl.super__Deque_impl_data._M_start._M_first;
  (pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)local_178._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   &(this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset =
       local_178._M_impl.super__Deque_impl_data._M_map_size;
  local_178._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)((ulong)local_178._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_f8,(long)this->nb_nodes,(bool *)&local_178
             ,(allocator_type *)local_128);
  __n = (size_type)
        ((int)((ulong)((long)(this->sccs).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->sccs).
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555);
  local_128 = (undefined1  [8])((ulong)(uint)local_128._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_178,__n,(value_type_conflict1 *)local_128,
             (allocator_type *)&local_1b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,__n,(value_type *)&local_178,(allocator_type *)&local_1b4);
  if ((__buckets_ptr)local_178._M_impl.super__Deque_impl_data._M_map != (__buckets_ptr)0x0) {
    operator_delete(local_178._M_impl.super__Deque_impl_data._M_map);
  }
  piVar2 = &local_178._M_impl.super__Deque_impl_data._M_finish;
  local_178._M_impl.super__Deque_impl_data._M_map_size = 1;
  local_178._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x3f800000;
  local_178._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_68 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->level2mandscc;
  local_178._M_impl.super__Deque_impl_data._M_map = &piVar2->_M_cur;
  local_78 = pvVar1;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)local_68,&local_178);
  local_184 = sink;
  local_180 = iVar10;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_178);
  local_178._M_impl.super__Deque_impl_data._M_map_size = 1;
  local_178._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x3f800000;
  local_178._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_70 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->mandscc2somenode;
  local_178._M_impl.super__Deque_impl_data._M_map = &piVar2->_M_cur;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign();
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_178);
  local_1b8 = 0;
  if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_c8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_1b0 = 0;
  }
  else {
    local_1b0 = 0;
    do {
      piVar13 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar13 = local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      iVar10 = piVar13[-1];
      uVar17 = (ulong)iVar10;
      iVar8 = iVar10 + 0x3f;
      if (-1 < (long)uVar17) {
        iVar8 = iVar10;
      }
      *(ulong *)(local_f8._0_8_ +
                ((long)(iVar8 >> 6) +
                ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) =
           *(ulong *)(local_f8._0_8_ +
                     ((long)(iVar8 >> 6) +
                     ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8) |
           1L << ((byte)iVar10 & 0x3f);
      if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_c8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_c8._M_impl.super__Deque_impl_data._M_finish._M_first);
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      iVar8 = (*this->_vptr_KosarajuSCC[4])(this);
      if ((char)iVar8 != '\0') {
        iVar8 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar17];
        uVar14 = (ulong)iVar8;
        iVar9 = iVar8 + 0x3f;
        if (-1 < (long)uVar14) {
          iVar9 = iVar8;
        }
        p_Var3 = (this->is_mand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        uVar15 = (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001);
        uVar18 = p_Var3[(long)(iVar9 >> 6) + uVar15 + 0xffffffffffffffff];
        if ((uVar18 >> (uVar14 & 0x3f) & 1) == 0) {
          p_Var3[(long)(iVar9 >> 6) + uVar15 + 0xffffffffffffffff] =
               1L << ((byte)iVar8 & 0x3f) | uVar18;
          local_178._M_impl.super__Deque_impl_data._M_map =
               (_Map_pointer)CONCAT44(local_178._M_impl.super__Deque_impl_data._M_map._4_4_,iVar8);
          pmVar11 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_70,(key_type *)&local_178);
          *pmVar11 = iVar10;
          local_1b0 = (ulong)((int)local_1b0 + 1);
        }
      }
      pvVar4 = (this->outgoing).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar12 = pvVar4[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pvVar4[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar12) {
        uVar14 = 0;
        uVar18 = 1;
        do {
          local_178._M_impl.super__Deque_impl_data._M_map =
               (_Map_pointer)
               CONCAT44(local_178._M_impl.super__Deque_impl_data._M_map._4_4_,
                        *(undefined4 *)
                         (*(long *)&(this->ends).
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[piVar12[uVar14]].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + 4));
          iVar10 = (*this->_vptr_KosarajuSCC[2])(this);
          if (((char)iVar10 == '\0') &&
             (iVar10 = (*this->_vptr_KosarajuSCC[3])(this), (char)iVar10 == '\0')) {
            piVar12 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar10 = piVar12[uVar17];
            uVar14 = (ulong)(int)local_178._M_impl.super__Deque_impl_data._M_map;
            iVar8 = piVar12[uVar14];
            if ((iVar10 != iVar8) &&
               (local_48.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar10].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[iVar8] == 0)) {
              this_00 = (vector<int,std::allocator<int>> *)
                        (local_60.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar10);
              iVar5._M_current = *(int **)(this_00 + 8);
              if (iVar5._M_current == *(int **)(this_00 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (this_00,iVar5,&local_1b8);
              }
              else {
                *iVar5._M_current = local_1b8;
                *(int **)(this_00 + 8) = iVar5._M_current + 1;
              }
              if (local_1a8.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_1a8.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::_M_realloc_insert<>
                          (&local_1a8,
                           (iterator)
                           local_1a8.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              else {
                ((local_1a8.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start = (pointer)0x0;
                ((local_1a8.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish = (pointer)0x0;
                ((local_1a8.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_end_of_storage = (pointer)0x0;
                local_1a8.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_1a8.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              piVar12 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar5._M_current =
                   local_1a8.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
              if (iVar5._M_current ==
                  local_1a8.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage) {
                local_128._0_4_ = piVar12[uVar17];
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_1a8.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,iVar5,(int *)local_128);
                piVar12 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              else {
                *iVar5._M_current = piVar12[uVar17];
                local_1a8.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = iVar5._M_current + 1;
              }
              local_128._0_4_ = piVar12[(int)local_178._M_impl.super__Deque_impl_data._M_map];
              iVar5._M_current =
                   local_1a8.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
              if (iVar5._M_current ==
                  local_1a8.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_1a8.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,iVar5,(int *)local_128);
                piVar12 = (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              else {
                *iVar5._M_current = piVar12[(int)local_178._M_impl.super__Deque_impl_data._M_map];
                local_1a8.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = iVar5._M_current + 1;
              }
              local_1b8 = local_1b8 + 1;
              local_48.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[piVar12[uVar17]].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [piVar12[(int)local_178._M_impl.super__Deque_impl_data._M_map]] = 1;
              uVar14 = (ulong)(int)local_178._M_impl.super__Deque_impl_data._M_map;
            }
            iVar10 = (int)local_178._M_impl.super__Deque_impl_data._M_map + 0x3f;
            if (-1 < (int)local_178._M_impl.super__Deque_impl_data._M_map) {
              iVar10 = (int)local_178._M_impl.super__Deque_impl_data._M_map;
            }
            if ((*(ulong *)(local_f8._0_8_ +
                           ((long)(iVar10 >> 6) +
                           ((ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) - 1)) * 8)
                 >> (uVar14 & 0x3f) & 1) == 0) {
              if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                          ((deque<int,std::allocator<int>> *)&local_c8,(int *)&local_178);
              }
              else {
                *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     (int)local_178._M_impl.super__Deque_impl_data._M_map;
                local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
                     local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
              }
            }
          }
          pvVar4 = (this->outgoing).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar12 = pvVar4[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          bVar7 = uVar18 < (ulong)((long)pvVar4[uVar17].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish - (long)piVar12 >> 2);
          uVar14 = uVar18;
          uVar18 = (ulong)((int)uVar18 + 1);
        } while (bVar7);
      }
    } while (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_c8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  local_178._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_178._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_178,0);
  local_1b4 = local_1b4 & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_128,
             (long)((int)((ulong)((long)(this->sccs).
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->sccs).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x55555555),(bool *)&local_1b4,&local_1b9);
  pvVar1 = local_78;
  if ((_Bit_type *)local_f8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_f8._0_8_);
  }
  local_d8 = local_108;
  local_e8 = local_118;
  uStack_e0 = uStack_110;
  uStack_dc = uStack_10c;
  local_f8._0_8_ = local_128;
  local_f8._8_8_ = piStack_120;
  topological_sort(this,local_180,&local_60,&local_1a8,
                   (queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_178,
                   (vector<bool,_std::allocator<bool>_> *)local_f8);
  iVar10 = (int)((long)(this->sccs).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->sccs).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  local_1b4 = iVar10 + 10;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_128,(long)iVar10,
             (value_type_conflict1 *)&local_1b4,(allocator_type *)&local_1b9);
  piVar12 = (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_128;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piStack_120;
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_118;
  local_128 = (undefined1  [8])0x0;
  piStack_120 = (pointer)0x0;
  local_118 = (_Bit_type *)0x0;
  if ((piVar12 != (pointer)0x0) && (operator_delete(piVar12), local_128 != (undefined1  [8])0x0)) {
    operator_delete((void *)local_128);
  }
  (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start[local_184]] = (int)local_1b0;
  if (local_178._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_178._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar10 = *(int *)(_Hash_node_base **)local_178._M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((_Hash_node_base *)local_178._M_impl.super__Deque_impl_data._M_start._M_cur ==
          (_Hash_node_base *)
          ((long)&((_Hash_node_base *)
                  ((long)local_178._M_impl.super__Deque_impl_data._M_start._M_last + -8))->_M_nxt +
          4)) {
        operator_delete(local_178._M_impl.super__Deque_impl_data._M_start._M_first);
        local_178._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_178._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_178._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)((long)local_178._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200);
        local_178._M_impl.super__Deque_impl_data._M_start._M_first =
             local_178._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_178._M_impl.super__Deque_impl_data._M_start._M_node =
             local_178._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_178._M_impl.super__Deque_impl_data._M_start._M_cur =
             (_Elt_pointer)
             ((long)(_Hash_node_base **)local_178._M_impl.super__Deque_impl_data._M_start._M_cur + 4
             );
      }
      uVar17 = (ulong)iVar10;
      piVar12 = (this->levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar8 = (int)((ulong)((long)(this->sccs).
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->sccs).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + 10
      ;
      piVar6 = local_60.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar17].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar16 = (long)local_60.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar17].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish - (long)piVar6;
      if (lVar16 != 0) {
        uVar14 = 0;
        do {
          iVar9 = piVar12[local_1a8.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[piVar6[uVar14]].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[1]];
          if (iVar8 < piVar12[local_1a8.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[piVar6[uVar14]].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[1]]) {
            iVar9 = iVar8;
          }
          iVar8 = iVar9;
          uVar14 = uVar14 + 1;
        } while ((uVar14 & 0xffffffff) < (ulong)(lVar16 >> 2));
      }
      iVar9 = piVar12[uVar17];
      if (iVar8 < piVar12[uVar17]) {
        iVar9 = iVar8;
      }
      piVar12[uVar17] = iVar9;
      iVar8 = iVar10 + 0x3f;
      if (-1 < iVar10) {
        iVar8 = iVar10;
      }
      if (((pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)(iVar8 >> 6) +
            (ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar17 & 0x3f) & 1) != 0) {
        piVar12[uVar17] = iVar9 + -1;
        pmVar11 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](local_68,piVar12 + uVar17);
        *pmVar11 = iVar10;
      }
    } while (local_178._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_178._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_178);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  if ((_Bit_type *)local_f8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_f8._0_8_);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_1a8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_60);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_c8);
  return;
}

Assistant:

void KosarajuSCC::_set_levels(int start, int sink) {
	const int start_scc = scc_of(start);
	std::stack<int> s;
	s.push(start);

	std::vector<std::vector<int> > scc_graph_out =
			std::vector<std::vector<int> >(nb_sccs(), std::vector<int>());
	std::vector<std::vector<int> > scc_graph_ends;
	is_mand = std::vector<bool>(nb_sccs(), false);
	std::vector<bool> seen = std::vector<bool>(nb_nodes, false);
	std::vector<std::vector<int> > matrix =
			std::vector<std::vector<int> >(nb_sccs(), std::vector<int>(nb_sccs(), 0));

	level2mandscc = std::unordered_map<int, int>();
	mandscc2somenode = std::unordered_map<int, int>();
	int edges = 0;
	int mand_sccs = 0;
	while (!s.empty()) {
		const int u = s.top();
		seen[u] = true;
		s.pop();
		if (mandatory_node(u) && !is_mand[scc_of(u)]) {
			is_mand[scc_of(u)] = true;
			mandscc2somenode[scc_of(u)] = u;
			mand_sccs++;
		}
		for (unsigned int i = 0; i < outgoing[u].size(); ++i) {
			const int e = outgoing[u][i];
			const int v = ends[e][1];
			if (ignore_edge(e) || ignore_node(v)) {
				continue;
			}
			if (scc_of(u) != scc_of(v) && matrix[scc_of(u)][scc_of(v)] == 0) {
				scc_graph_out[scc_of(u)].push_back(edges);
				scc_graph_ends.emplace_back();
				scc_graph_ends.back().push_back(scc_of(u));
				scc_graph_ends.back().push_back(scc_of(v));
				edges++;
				matrix[scc_of(u)][scc_of(v)] = 1;
			}
			if (!seen[v]) {
				s.push(v);
			}
		}
	}
	/*std::cout<<"\n";
		std::cout<<"SCC GRAPH"<<std::endl;
		for (int i = 0; i < scc_graph_out.size(); i++) {
		for (int j = 0; j < scc_graph_out[i].size(); j++) {
		std::cout<<scc_graph_out[i][j]<<"(to "
		<<scc_graph_ends[scc_graph_out[i][j]][1]<<") ";
		}
		std::cout<<std::endl;
		}
		std::cout<<std::endl;
		std::cout<<"MANDS ";
		for (int i = 0; i < nb_sccs(); i++) {
		std::cout<<is_mand[i]<<" ";
		}
		std::cout<<std::endl;
		//*/
	std::queue<int> topo;
	seen = std::vector<bool>(nb_sccs(), false);
	topological_sort(start_scc, scc_graph_out, scc_graph_ends, topo, seen);

	levels = std::vector<int>(nb_sccs(), nb_sccs() + 10);
	levels[scc_of(sink)] = mand_sccs;

	while (!topo.empty()) {
		const int u = topo.front();
		topo.pop();
		int min = nb_sccs() + 10;
		// std::cout<<"Looking at "<<u<<std::endl;
		for (unsigned int i = 0; i < scc_graph_out[u].size(); ++i) {
			const int e = scc_graph_out[u][i];
			const int v = scc_graph_ends[e][1];
			min = (min < levels[v]) ? min : levels[v];
		}
		levels[u] = (min < levels[u]) ? min : levels[u];
		if (is_mand[u]) {
			levels[u] -= 1;
			level2mandscc[levels[u]] = u;
		}
	}
	/*std::cout<<"LEVELS: "<<mand_sccs<<"     ";
		for (int i = 0; i < nb_sccs(); i++)
		std::cout<<levels[i]<<" ";
		std::cout<<std::endl;
	*/
}